

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O1

void __thiscall libtorrent::aux::dh_key_exchange::dh_key_exchange(dh_key_exchange *this)

{
  long lVar1;
  difference_type in_RDX;
  data_type *pdVar2;
  byte bVar3;
  span<char> buffer;
  array<std::uint8_t,_96> random_key;
  aux aaStack_168 [96];
  data_type local_108;
  undefined8 local_a8;
  data_type local_98;
  undefined8 local_38;
  
  bVar3 = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[10] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0xb] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[8] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[9] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[6] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[7] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[4] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[5] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[3] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1] = 0;
  (this->m_dh_local_key).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_limbs = 1;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[3] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[4] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[5] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[6] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[7] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[8] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[9] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[10] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0xb] = 0;
  (this->m_dh_local_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_limbs = 1;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[1] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[2] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[3] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[4] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[5] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[6] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[7] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[8] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[9] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[10] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_wrapper.m_data[0xb] = 0;
  (this->m_dh_shared_secret).m_backend.
  super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
  .m_limbs = 1;
  (this->m_xor_mask).m_number._M_elems[0] = 0;
  (this->m_xor_mask).m_number._M_elems[1] = 0;
  (this->m_xor_mask).m_number._M_elems[2] = 0;
  (this->m_xor_mask).m_number._M_elems[3] = 0;
  (this->m_xor_mask).m_number._M_elems[4] = 0;
  buffer.m_len = in_RDX;
  buffer.m_ptr = (char *)0x60;
  random_bytes(aaStack_168,buffer);
  boost::multiprecision::detail::
  import_bits_generic<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_char*>
            (&this->m_dh_local_secret,(uchar *)aaStack_168,(uchar *)local_108.m_data,0,true);
  local_108.m_data[1] = 0;
  local_108.m_data[10] = 0;
  local_108.m_data[0xb] = 0;
  local_108.m_data[8] = 0;
  local_108.m_data[9] = 0;
  local_108.m_data[6] = 0;
  local_108.m_data[7] = 0;
  local_108.m_data[4] = 0;
  local_108.m_data[5] = 0;
  local_108.m_data[2] = 0;
  local_108.m_data[3] = 0;
  local_108.m_data[0] = 2;
  local_a8 = 1;
  local_98.m_data[0] = 0;
  local_98.m_data[1] = 0;
  local_98.m_data[2] = 0;
  local_98.m_data[3] = 0;
  local_98.m_data[4] = 0;
  local_98.m_data[5] = 0;
  local_98.m_data[6] = 0;
  local_98.m_data[7] = 0;
  local_98.m_data[8] = 0;
  local_98.m_data[9] = 0;
  local_98.m_data[10] = 0;
  local_98.m_data[0xb] = 0;
  local_38 = 1;
  boost::multiprecision::default_ops::
  eval_powm<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>>
            ((cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_98,
             (cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)&local_108,&(this->m_dh_local_secret).m_backend,
             (cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
              *)(anonymous_namespace)::dh_prime);
  pdVar2 = &local_98;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    (this->m_dh_local_key).m_backend.
    super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_first_limb = pdVar2->m_data[0];
    pdVar2 = (data_type *)((long)pdVar2 + (ulong)bVar3 * -0x10 + 8);
    this = (dh_key_exchange *)((long)this + (ulong)bVar3 * -0x10 + 8);
  }
  return;
}

Assistant:

dh_key_exchange::dh_key_exchange()
	{
		aux::array<std::uint8_t, 96> random_key;
		aux::random_bytes({reinterpret_cast<char*>(random_key.data())
			, static_cast<std::ptrdiff_t>(random_key.size())});

		// create local key (random)
		mp::import_bits(m_dh_local_secret, random_key.begin(), random_key.end());

		// key = (2 ^ secret) % prime
		m_dh_local_key = mp::powm(key_t(2), m_dh_local_secret, dh_prime);
	}